

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateES5HeapArguments_TTD
          (JavascriptLibrary *this,uint32 numOfArguments,uint32 formalCount,
          ActivationObject *frameObject,byte *deletedArray)

{
  HeapArgumentsObject *this_00;
  RecyclableObject *pRVar1;
  uint local_34;
  uint32 i;
  HeapArgumentsObject *argsObj;
  byte *deletedArray_local;
  ActivationObject *frameObject_local;
  uint32 formalCount_local;
  uint32 numOfArguments_local;
  JavascriptLibrary *this_local;
  
  this_00 = CreateHeapArguments(this,frameObject,formalCount,false);
  HeapArgumentsObject::SetNumberOfArguments(this_00,numOfArguments);
  for (local_34 = 0; local_34 < formalCount; local_34 = local_34 + 1) {
    if (deletedArray[local_34] != '\0') {
      (*(this_00->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                (this_00,(ulong)local_34);
    }
  }
  pRVar1 = (RecyclableObject *)HeapArgumentsObject::ConvertToES5HeapArgumentsObject_TTD(this_00);
  return pRVar1;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateES5HeapArguments_TTD(uint32 numOfArguments, uint32 formalCount, ActivationObject* frameObject, byte* deletedArray)
    {
        Js::HeapArgumentsObject* argsObj = this->CreateHeapArguments(frameObject, formalCount);

        argsObj->SetNumberOfArguments(numOfArguments);
        for(uint32 i = 0; i < formalCount; ++i)
        {
            if(deletedArray[i])
            {
                argsObj->DeleteItemAt(i);
            }
        }

        return argsObj->ConvertToES5HeapArgumentsObject_TTD();
    }